

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestSpanSet(void)

{
  uint __line;
  iterator iVar1;
  char *__assertion;
  Span *s4;
  Span *s2;
  Span *s1;
  Span *s3;
  Span *local_88;
  SpanSet set;
  Span bound;
  
  puts("===================== TestSpanSet BEGIN =====================");
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &set._M_t._M_impl.super__Rb_tree_header._M_header;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  s1 = tcmalloc::NewSpan(4,2);
  s2 = tcmalloc::NewSpan(1,3);
  s3 = tcmalloc::NewSpan(10,3);
  s4 = tcmalloc::NewSpan(0xc,5);
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&set,&s1);
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&set,&s2);
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&set,&s3);
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&set,&s4);
  if (set._M_t._M_impl.super__Rb_tree_header._M_node_count == 4) {
    std::
    _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
    ::_M_insert_unique<tcmalloc::Span*const&>
              ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
                *)&set,&s1);
    if (set._M_t._M_impl.super__Rb_tree_header._M_node_count == 4) {
      bound.freelist.free_count_ = 0;
      bound.freelist.head_ = (void *)0x0;
      bound.npages = 3;
      bound.page_id = 0;
      local_88 = &bound;
      iVar1 = std::
              _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
              ::upper_bound(&set._M_t,&local_88);
      if (*(Span **)(iVar1._M_node + 1) == s2) {
        bound.npages = 4;
        bound.page_id = 0;
        local_88 = &bound;
        iVar1 = std::
                _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
                ::upper_bound(&set._M_t,&local_88);
        if (*(Span **)(iVar1._M_node + 1) == s4) {
          tcmalloc::DeleteSpan(s1);
          tcmalloc::DeleteSpan(s2);
          tcmalloc::DeleteSpan(s3);
          tcmalloc::DeleteSpan(s4);
          puts("===================== TestSpanSet PASS =====================");
          std::
          _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
          ::~_Rb_tree(&set._M_t);
          return;
        }
        __assertion = "(*(set.upper_bound(&bound))) == s4";
        __line = 100;
      }
      else {
        __assertion = "(*(set.upper_bound(&bound))) == s2";
        __line = 0x61;
      }
    }
    else {
      __assertion = "set.size() == 4";
      __line = 0x5c;
    }
  }
  else {
    __assertion = "set.size() == 4";
    __line = 0x5a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,__line,"void TestSpanSet()");
}

Assistant:

void TestSpanSet() {
    printf("===================== TestSpanSet BEGIN =====================\n");
    tcmalloc::SpanSet set;
    tcmalloc::Span* s1 = tcmalloc::NewSpan(4, 2);
    tcmalloc::Span* s2 = tcmalloc::NewSpan(1, 3);
    tcmalloc::Span* s3 = tcmalloc::NewSpan(10, 3);
    tcmalloc::Span* s4 = tcmalloc::NewSpan(12, 5);

    set.insert(s1);
    set.insert(s2);
    set.insert(s3);
    set.insert(s4);
    assert(set.size() == 4);
    set.insert(s1);
    assert(set.size() == 4);

    tcmalloc::Span bound;
    bound.npages = 3;
    bound.page_id = 0;
    assert((*(set.upper_bound(&bound))) == s2);
    bound.npages = 4;
    bound.page_id = 0;
    assert((*(set.upper_bound(&bound))) == s4);

    tcmalloc::DeleteSpan(s1);
    tcmalloc::DeleteSpan(s2);
    tcmalloc::DeleteSpan(s3);
    tcmalloc::DeleteSpan(s4);
    printf("===================== TestSpanSet PASS =====================\n");
}